

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O0

void __thiscall FPatchTexture::FPatchTexture(FPatchTexture *this,int lumpnum,patch_t *header)

{
  patch_t *header_local;
  int lumpnum_local;
  FPatchTexture *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,lumpnum);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPatchTexture_00b87e60;
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  this->hackflag = false;
  (this->super_FTexture).Width = header->width;
  (this->super_FTexture).Height = header->height;
  (this->super_FTexture).LeftOffset = header->leftoffset;
  (this->super_FTexture).TopOffset = header->topoffset;
  FTexture::CalcBitSize(&this->super_FTexture);
  return;
}

Assistant:

FPatchTexture::FPatchTexture (int lumpnum, patch_t * header)
: FTexture(NULL, lumpnum), Pixels(0), Spans(0), hackflag(false)
{
	Width = header->width;
	Height = header->height;
	LeftOffset = header->leftoffset;
	TopOffset = header->topoffset;
	CalcBitSize ();
}